

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void testutil_random_fe_non_zero(secp256k1_fe *nz)

{
  int iVar1;
  
  do {
    testutil_random_fe(nz);
    iVar1 = secp256k1_fe_impl_is_zero(nz);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void testutil_random_fe_non_zero(secp256k1_fe *nz) {
    do {
        testutil_random_fe(nz);
    } while (secp256k1_fe_is_zero(nz));
}